

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl
          (MessageGenerator *this,Printer *p)

{
  pointer *pppFVar1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  byte bVar2;
  ushort uVar3;
  pointer ppFVar4;
  FieldDescriptor *pFVar5;
  FieldDescriptor *field_00;
  iterator __position;
  ushort *puVar6;
  FieldChunk *pFVar7;
  FieldChunk *pFVar8;
  Printer *pPVar9;
  MessageGenerator *this_00;
  bool bVar10;
  bool bVar11;
  HasbitMode HVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint32_t uVar16;
  ChunkIterator CVar17;
  undefined7 extraout_var;
  optional<float> oVar18;
  FieldGenerator *this_01;
  FieldDescriptor **ppFVar19;
  long *plVar20;
  Nonnull<const_char_*> pcVar21;
  Options *in_RCX;
  FieldChunk *pFVar22;
  undefined8 uVar23;
  uint32_t uVar24;
  FieldChunk *pFVar25;
  char *pcVar26;
  const_iterator __end3;
  ChunkIterator end;
  pointer ppFVar28;
  _Optional_payload_base<int> options;
  const_iterator __begin3;
  long lVar29;
  int iVar30;
  ChunkIterator it;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view prefix;
  string_view prefix_00;
  undefined1 in_stack_fffffffffffffb28;
  Printer *p_local;
  int cached_has_word_index;
  char local_4c1;
  MessageGenerator *local_4c0;
  undefined8 local_4b8;
  _Optional_payload_base<int> local_4b0;
  anon_class_1_0_00000001 local_4a1;
  Formatter format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  value_type oneof;
  vector<int,_std::allocator<int>_> *local_450;
  Printer *local_448;
  int local_43c;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428;
  undefined7 uStack_427;
  undefined8 uStack_420;
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  chunks;
  string local_400;
  Iterator __begin3_1;
  string local_3d0;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  FieldChunk *local_390;
  FieldChunk *local_388;
  FieldChunk *local_380;
  Iterator __end3_1;
  undefined1 local_368 [24];
  code *local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _Alloc_hider local_338;
  code *local_330;
  basic_string_view<char,_std::char_traits<char>_> local_320;
  FieldDescriptor *field;
  undefined1 local_308 [8];
  FieldDescriptor local_300;
  Sub local_258;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined8 uStack_d0;
  long *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  _Optional_payload_base<int> _Var27;
  
  options = (_Optional_payload_base<int>)&this->options_;
  p_local = p;
  local_4c0 = this;
  SimpleBaseClass_abi_cxx11_((string *)&field,(cpp *)this->descriptor_,(Descriptor *)options,in_RCX)
  ;
  if (field != &local_300) {
    operator_delete(field,local_300._0_8_ + 1);
  }
  if (local_308 != (undefined1  [8])0x0) {
    return;
  }
  format.printer_ = p_local;
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  format_00._M_str =
       "void $classname$::MergeImpl($pb$::MessageLite& to_msg, const $pb$::MessageLite& from_msg) {\n$WeakDescriptorSelfPin$  auto* const _this = static_cast<$classname$*>(&to_msg);\n  auto& from = static_cast<const $classname$&>(from_msg);\n"
  ;
  format_00._M_len = 0xe7;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (p_local,(Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )ZEXT816(0),&format.vars_,format_00);
  (format.printer_)->indent_ =
       (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
  bVar10 = RequiresArena(local_4c0,kMergeFrom);
  if (bVar10) {
    io::Printer::Emit(p_local,0,0,0x33,"\n      $pb$::Arena* arena = _this->GetArena();\n    ");
  }
  format_01._M_str =
       "$annotate_mergefrom$// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n"
  ;
  format_01._M_len = 0x5d;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (format.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&format.vars_,format_01);
  format_02._M_str = "$DCHK$_NE(&from, _this);\n";
  format_02._M_len = 0x19;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (format.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&format.vars_,format_02);
  format_03._M_str = "$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n";
  format_03._M_len = 0x37;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (format.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&format.vars_,format_03);
  bVar10 = ShouldSplit(local_4c0->descriptor_,(Options *)options);
  if (bVar10) {
    format_04._M_str =
         "if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n  _this->PrepareSplitMessageForWrite();\n}\n"
    ;
    format_04._M_len = 99;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (format.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&format.vars_,format_04);
  }
  ppFVar28 = (local_4c0->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar4 = (local_4c0->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  chunks.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chunks.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  chunks.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var27 = options;
  if (ppFVar28 == ppFVar4) {
    cached_has_word_index = -1;
  }
  else {
    do {
      local_4b0 = _Var27;
      this_00 = local_4c0;
      pFVar5 = *ppFVar28;
      field = pFVar5;
      if (chunks.
          super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          chunks.
          super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0025da88:
        bVar10 = protobuf::internal::cpp::HasHasbit(field);
        local_478._M_dataplus._M_p._0_1_ = bVar10;
        bVar10 = IsRarelyPresent(field,(Options *)options);
        __begin3_1.idx = CONCAT31(__begin3_1.idx._1_3_,bVar10);
        bVar10 = ShouldSplit(field,(Options *)options);
        __end3_1.idx = CONCAT31(__end3_1.idx._1_3_,bVar10);
        std::
        vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
        ::emplace_back<bool,bool,bool>
                  ((vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
                    *)&chunks,(bool *)&local_478,(bool *)&__begin3_1,(bool *)&__end3_1);
      }
      else {
        field_00 = chunks.
                   super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1];
        iVar13 = HasBitIndex(local_4c0,field_00);
        options = local_4b0;
        iVar30 = iVar13 + 7;
        if (-1 < iVar13) {
          iVar30 = iVar13;
        }
        iVar30 = iVar30 >> 3;
        if (iVar13 == -1) {
          iVar30 = -1;
        }
        iVar14 = HasBitIndex(this_00,pFVar5);
        iVar13 = iVar14 + 7;
        if (-1 < iVar14) {
          iVar13 = iVar14;
        }
        iVar13 = iVar13 >> 3;
        if (iVar14 == -1) {
          iVar13 = -1;
        }
        if (iVar30 != iVar13) goto LAB_0025da88;
        bVar10 = IsLikelyPresent(field_00,(Options *)options);
        bVar11 = IsLikelyPresent(pFVar5,(Options *)options);
        if (bVar10 != bVar11) goto LAB_0025da88;
        bVar10 = ShouldSplit(field_00,(Options *)options);
        bVar11 = ShouldSplit(pFVar5,(Options *)options);
        if (bVar10 != bVar11) goto LAB_0025da88;
      }
      __position._M_current =
           chunks.
           super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          chunks.
          super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&chunks.
                       super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].fields,__position,&field);
      }
      else {
        *__position._M_current = field;
        pppFVar1 = &chunks.
                    super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      ppFVar28 = ppFVar28 + 1;
      _Var27 = local_4b0;
    } while (ppFVar28 != ppFVar4);
    cached_has_word_index = -1;
    if (chunks.
        super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        chunks.
        super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_450 = &local_4c0->has_bit_indices_;
      local_448 = (Printer *)&local_4c0->field_generators_;
      local_390 = chunks.
                  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      CVar17._M_current =
           chunks.
           super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pFVar7 = chunks.
               super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
               ._M_impl.super__Vector_impl_data._M_start;
      it._M_current =
           chunks.
           super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pFVar25 = chunks.
                super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                ._M_impl.super__Vector_impl_data._M_finish;
LAB_0025db7d:
      do {
        iVar30 = cached_has_word_index;
        pFVar22 = pFVar7 + 1;
        end._M_current = pFVar25;
        if (((pFVar22 != pFVar25) &&
            (end._M_current = CVar17._M_current + 1,
            (it._M_current)->has_hasbit == pFVar22->has_hasbit)) &&
           ((it._M_current)->is_rarely_present == pFVar7[1].is_rarely_present)) {
          pFVar8 = pFVar7 + 1;
          CVar17._M_current = end._M_current;
          end._M_current = pFVar22;
          pFVar7 = pFVar22;
          if ((it._M_current)->should_split == pFVar8->should_split) goto LAB_0025db7d;
        }
        field = &local_300;
        _Var27 = (_Optional_payload_base<int>)&field;
        std::__cxx11::string::_M_construct<char_const*>((string *)_Var27,"from.","");
        bVar10 = cpp::anon_unknown_0::MaybeEmitHaswordsCheck
                           (it,end,(Options *)options,local_450,iVar30,(string *)_Var27,p_local);
        if (field != &local_300) {
          operator_delete(field,local_300._0_8_ + 1);
        }
        CVar17._M_current = it._M_current;
        local_4c1 = bVar10;
        if (it._M_current != end._M_current) {
          do {
            local_388 = end._M_current;
            ppFVar28 = ((it._M_current)->fields).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            uVar15 = HasBitIndex(local_4c0,*ppFVar28);
            if (((uVar15 < 0xfffffff1) || ((0x40ffU >> (uVar15 + 0xf & 0x1f) & 1) == 0)) &&
               (ppFVar4 = ((it._M_current)->fields).
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
               8 < (ulong)((long)ppFVar4 - (long)ppFVar28))) {
              bVar10 = IsLikelyPresent(ppFVar4[-1],(Options *)options);
              local_4b8 = (Sub *)(CONCAT44(local_4b8._4_4_,(int)CONCAT71(extraout_var,bVar10)) ^ 1);
            }
            else {
              local_4b8 = (Sub *)((ulong)local_4b8 & 0xffffffff00000000);
            }
            fields = &(it._M_current)->fields;
            cpp::anon_unknown_0::DebugAssertUniformLikelyPresence(fields,(Options *)options);
            iVar30 = cached_has_word_index;
            if ((7 < uVar15 + 0xf) && (uVar15 != 0xffffffff)) {
              iVar14 = HasBitIndex(local_4c0,
                                   *(fields->
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
              iVar13 = iVar14 + 0x1f;
              if (-1 < iVar14) {
                iVar13 = iVar14;
              }
              iVar13 = iVar13 >> 5;
              if (iVar14 == -1) {
                iVar13 = -1;
              }
              if (iVar30 != iVar13) {
                cached_has_word_index = iVar13;
                Formatter::operator()
                          (&format,"cached_has_bits = from.$has_bits$[$1$];\n",
                           &cached_has_word_index);
              }
            }
            if ((char)local_4b8 != '\0') {
              uVar16 = GenChunkMask(fields,local_450);
              iVar30 = 0;
              uVar15 = uVar16;
              if (uVar16 != 0) {
                do {
                  iVar30 = iVar30 + (uVar15 & 1);
                  bVar10 = 1 < uVar15;
                  uVar15 = uVar15 >> 1;
                } while (bVar10);
                if (1 < iVar30) {
                  uVar15 = 0;
                  uVar24 = uVar16;
                  do {
                    uVar15 = uVar15 + (uVar24 & 1);
                    bVar10 = 1 < uVar24;
                    uVar24 = uVar24 >> 1;
                  } while (bVar10);
                  if (8 < (int)uVar15) {
                    pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                        (8,(ulong)uVar15,"8 >= popcnt(chunk_mask)");
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)&field,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                               ,0x10ef,pcVar21);
                    goto LAB_0025e8a9;
                  }
                  oVar18 = GetFieldGroupPresenceProbability(fields,(Options *)options);
                  cpp::(anonymous_namespace)::GenerateConditionMaybeWithProbability_abi_cxx11_
                            ((string *)&field,(_anonymous_namespace_ *)(ulong)uVar16,
                             (uint32_t)
                             oVar18.super__Optional_base<float,_true,_true>._M_payload.
                             super__Optional_payload_base<float>._M_payload,(optional<float>)0x1,
                             false,(optional<int>)_Var27);
                  Formatter::operator()(&format,"if ($1$) {\n",(string *)&field);
                  if (field != &local_300) {
                    operator_delete(field,local_300._0_8_ + 1);
                  }
                  (format.printer_)->indent_ =
                       (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
                  goto LAB_0025dd9f;
                }
              }
              pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (2,(long)iVar30,"2 <= popcnt(chunk_mask)");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&field,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                         ,0x10ee,pcVar21);
LAB_0025e8a9:
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&field);
            }
LAB_0025dd9f:
            ppFVar4 = ((it._M_current)->fields).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_380 = it._M_current;
            for (ppFVar28 = ((it._M_current)->fields).
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start; pFVar25 = local_380,
                pFVar7 = local_388, options = local_4b0, ppFVar28 != ppFVar4;
                ppFVar28 = ppFVar28 + 1) {
              pFVar5 = *ppFVar28;
              this_01 = FieldGeneratorTable::get((FieldGeneratorTable *)local_448,pFVar5);
              bVar2 = pFVar5->field_0x1;
              bVar10 = (bool)((bVar2 & 0x20) >> 5);
              if (0xbf < bVar2 != bVar10) {
                pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                    (bVar10,0xbf < bVar2,
                                     "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED")
                ;
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&field,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb54,pcVar21);
                goto LAB_0025e8a9;
              }
              if ((bVar2 & 0x20) == 0) {
                bVar10 = FieldDescriptor::is_required(pFVar5);
                if (!bVar10) {
                  bVar2 = pFVar5->field_0x1;
                  bVar10 = (bool)((bVar2 & 0x20) >> 5);
                  if (0xbf < bVar2 != bVar10) {
                    pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                        (bVar10,0xbf < bVar2,
                                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED"
                                        );
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)&field,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                               ,0xb54,pcVar21);
                    goto LAB_0025e8a9;
                  }
                  if (((bVar2 & 0x20) == 0) &&
                     (bVar10 = protobuf::internal::cpp::HasHasbit(pFVar5), pPVar9 = p_local, !bVar10
                     )) {
                    bVar10 = ShouldSplit(pFVar5,(Options *)local_4b0);
                    local_348._8_8_ = &p_local;
                    local_330 = absl::lts_20250127::internal_any_invocable::
                                LocalInvoker<false,void,google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__0&>
                    ;
                    local_338._M_p =
                         (pointer)absl::lts_20250127::internal_any_invocable::LocalManagerTrivial;
                    prefix._M_str = (char *)pFVar5;
                    prefix._M_len = (size_t)"from.";
                    _Var27 = local_4b0;
                    local_348._M_allocated_capacity = (size_type)this_01;
                    cpp::anon_unknown_0::MayEmitMutableIfNonDefaultCheck
                              ((anon_unknown_0 *)pPVar9,(Printer *)&DAT_00000005,prefix,
                               (FieldDescriptor *)(ulong)bVar10,local_4b0._M_payload._0_1_,
                               (Options *)&local_348,(AnyInvocable<void_()> *)0x1,
                               (bool)in_stack_fffffffffffffb28);
                    (*(code *)local_338._M_p)(1,&local_348,&local_348);
                    goto LAB_0025e1b2;
                  }
                }
                iVar30 = cached_has_word_index;
                if ((pFVar5->options_->field_0)._impl_.weak_ == false) {
                  iVar14 = HasBitIndex(local_4c0,pFVar5);
                  iVar13 = iVar14 + 0x1f;
                  if (-1 < iVar14) {
                    iVar13 = iVar14;
                  }
                  iVar13 = iVar13 >> 5;
                  if (iVar14 == -1) {
                    iVar13 = -1;
                  }
                  if (iVar30 == iVar13) {
                    bVar10 = protobuf::internal::cpp::HasHasbit(pFVar5);
                    if (bVar10) {
                      if ((pFVar5->field_0x1 & 8) == 0) {
                        ppFVar19 = &pFVar5->containing_type_->fields_;
                      }
                      else if ((pFVar5->scope_).extension_scope == (Descriptor *)0x0) {
                        ppFVar19 = &pFVar5->file_->extensions_;
                      }
                      else {
                        ppFVar19 = &((pFVar5->scope_).extension_scope)->extensions_;
                      }
                      iVar30 = (local_450->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start
                               [(int)((ulong)((long)pFVar5 - (long)*ppFVar19) >> 3) * -0x45d1745d];
                      oVar18 = GetPresenceProbability(pFVar5,(Options *)local_4b0);
                      cpp::(anonymous_namespace)::GenerateConditionMaybeWithProbability_abi_cxx11_
                                ((string *)&field,
                                 (_anonymous_namespace_ *)(ulong)(uint)(1 << ((byte)iVar30 & 0x1f)),
                                 (uint32_t)
                                 oVar18.super__Optional_base<float,_true,_true>._M_payload.
                                 super__Optional_payload_base<float>._M_payload,(optional<float>)0x1
                                 ,false,(optional<int>)_Var27);
                      Formatter::operator()(&format,"if ($1$) {\n",(string *)&field);
                      if (field != &local_300) {
                        operator_delete(field,local_300._0_8_ + 1);
                      }
                      (format.printer_)->indent_ =
                           (format.printer_)->indent_ +
                           ((format.printer_)->options_).spaces_per_indent;
                      HVar12 = protobuf::internal::cpp::GetFieldHasbitMode(pFVar5);
                      pPVar9 = p_local;
                      if (HVar12 == kHintHasbit) {
                        bVar10 = ShouldSplit(pFVar5,(Options *)local_4b0);
                        local_368._8_8_ = &p_local;
                        local_350 = absl::lts_20250127::internal_any_invocable::
                                    LocalInvoker<false,void,google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__1&>
                        ;
                        local_368._16_8_ =
                             absl::lts_20250127::internal_any_invocable::LocalManagerTrivial;
                        prefix_00._M_str = (char *)pFVar5;
                        prefix_00._M_len = (size_t)"from.";
                        local_368._0_8_ = this_01;
                        cpp::anon_unknown_0::MayEmitMutableIfNonDefaultCheck
                                  ((anon_unknown_0 *)pPVar9,(Printer *)&DAT_00000005,prefix_00,
                                   (FieldDescriptor *)(ulong)bVar10,local_4b0._M_payload._0_1_,
                                   (Options *)local_368,(AnyInvocable<void_()> *)0x0,
                                   (bool)in_stack_fffffffffffffb28);
                        (*(code *)local_368._16_8_)(1,(Options *)local_368,(Options *)local_368);
                      }
                      else {
                        HVar12 = protobuf::internal::cpp::GetFieldHasbitMode(pFVar5);
                        if (HVar12 != kTrueHasbit) {
                          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                    ((LogMessageFatal *)&field,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                                     ,0x111f,"GetFieldHasbitMode(field) == HasbitMode::kTrueHasbit")
                          ;
                          goto LAB_0025e8a9;
                        }
                        if ((char)local_4b8 != '\0') {
                          bVar2 = pFVar5->field_0x1;
                          bVar10 = (bool)((bVar2 & 0x20) >> 5);
                          if (0xbf < bVar2 != bVar10) {
                            pcVar21 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                                (bVar10,0xbf < bVar2,
                                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED"
                                                );
                            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                      ((LogMessageFatal *)&field,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                                       ,0xb54,pcVar21);
                            goto LAB_0025e8a9;
                          }
                          if (((bVar2 & 0x28) == 0) &&
                             (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar5->type_ * 4
                                      ) - 1U < 8)) {
                            FieldGenerator::GenerateCopyConstructorCode(this_01,p_local);
                            goto LAB_0025e188;
                          }
                        }
                        FieldGenerator::GenerateMergingCode(this_01,p_local);
                      }
LAB_0025e188:
                      io::Printer::Outdent(format.printer_);
                      format_07._M_str = "}\n";
                      format_07._M_len = 2;
                      _Var27 = (_Optional_payload_base<int>)
                               ((long)
                                "if (other.has$capitalized_name$()) {\n  $name$_ = other.$name$_;\n  $set_has_field_bit_builder$\n  $on_changed$\n}\n"
                               + 0x6d);
                      io::Printer::
                      FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                                (format.printer_,
                                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )ZEXT816(0),&format.vars_,format_07);
                      goto LAB_0025e1b2;
                    }
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)&field,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                               ,0x1111,"HasHasbit(field)");
                    goto LAB_0025e8a9;
                  }
                }
                pPVar9 = p_local;
                HasBitVars_abi_cxx11_
                          ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&field,local_4c0,pFVar5);
                io::Printer::
                WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>
                          ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
                            *)&local_478,pPVar9,
                           (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&field);
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&field);
                format_05._M_str = "if ((from.$has_bits$[$has_array_index$] & $has_mask$) != 0) {\n"
                ;
                format_05._M_len = 0x3e;
                io::Printer::
                FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                          (format.printer_,
                           (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )ZEXT816(0),&format.vars_,format_05);
                (format.printer_)->indent_ =
                     (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
                FieldGenerator::GenerateMergingCode(this_01,p_local);
                io::Printer::Outdent(format.printer_);
                format_06._M_str = "}\n";
                format_06._M_len = 2;
                _Var27 = (_Optional_payload_base<int>)
                         ((long)
                          "if (other.has$capitalized_name$()) {\n  $name$_ = other.$name$_;\n  $set_has_field_bit_builder$\n  $on_changed$\n}\n"
                         + 0x6d);
                io::Printer::
                FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                          (format.printer_,
                           (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )ZEXT816(0),&format.vars_,format_06);
                if ((char)local_478._M_dataplus._M_p == '\x01') {
                  std::
                  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                  ::pop_back((vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                              *)(local_478._M_string_length + 0x98));
                }
              }
              else {
                FieldGenerator::GenerateMergingCode(this_01,p_local);
              }
LAB_0025e1b2:
            }
            if ((char)local_4b8 != '\0') {
              io::Printer::Outdent(format.printer_);
              format_08._M_str = "}\n";
              format_08._M_len = 2;
              _Var27 = (_Optional_payload_base<int>)
                       ((long)
                        "if (other.has$capitalized_name$()) {\n  $name$_ = other.$name$_;\n  $set_has_field_bit_builder$\n  $on_changed$\n}\n"
                       + 0x6d);
              io::Printer::
              FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                        (format.printer_,
                         (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )ZEXT816(0),&format.vars_,format_08);
            }
            it._M_current = pFVar25 + 1;
            CVar17._M_current = it._M_current;
            end._M_current = local_388;
          } while (it._M_current != pFVar7);
        }
        pFVar25 = local_390;
        if (local_4c1 != '\0') {
          io::Printer::Outdent(p_local);
          io::Printer::Emit(p_local,0,0,0x11,"\n        }\n      ");
          cached_has_word_index = -1;
        }
        pFVar7 = CVar17._M_current;
        it._M_current = CVar17._M_current;
      } while (CVar17._M_current != pFVar25);
    }
  }
  iVar30 = local_4c0->max_has_bit_index_;
  if (iVar30 - 1U < 0x20) {
    pcVar26 = "\n      _this->$has_bits$[0] |= cached_has_bits;\n    ";
    uVar23 = 0x34;
  }
  else {
    iVar13 = iVar30 + 0x3e;
    if (-1 < iVar30 + 0x1f) {
      iVar13 = iVar30 + 0x1f;
    }
    if ((uint)(iVar13 >> 5) < 2) goto LAB_0025e304;
    pcVar26 = "\n      _this->$has_bits$.Or(from.$has_bits$);\n    ";
    uVar23 = 0x32;
  }
  io::Printer::Emit(p_local,0,0,uVar23,pcVar26);
LAB_0025e304:
  __begin3_1.descriptor = local_4c0->descriptor_;
  __begin3_1.idx = 0;
  __end3_1.idx = (__begin3_1.descriptor)->real_oneof_decl_count_;
  local_4b0 = (_Optional_payload_base<int>)&local_258;
  local_4b8 = &local_1a0;
  __end3_1.descriptor = __begin3_1.descriptor;
  while( true ) {
    bVar10 = cpp::operator==(&__begin3_1,&__end3_1);
    if (bVar10) break;
    oneof = OneOfRangeImpl::Iterator::operator*(&__begin3_1);
    pPVar9 = p_local;
    local_3b0._0_8_ = &local_3a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"name","");
    local_448 = pPVar9;
    puVar6 = (ushort *)(oneof->all_names_).payload_;
    local_320._M_len = (size_t)*puVar6;
    local_320._M_str = (char *)((long)puVar6 + ~local_320._M_len);
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              ((Sub *)&field,(string *)local_3b0,&local_320);
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"NAME","");
    puVar6 = (ushort *)(oneof->all_names_).payload_;
    uVar3 = *puVar6;
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    local_478._M_string_length = 0;
    local_478.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)&local_478,(char)uVar3);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper
              (local_478._M_dataplus._M_p,(Nullable<const_char_*>)((long)puVar6 + ~(ulong)uVar3),
               (ulong)uVar3);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_258,&local_400,&local_478);
    local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"index","");
    local_43c = (int)((ulong)((long)oneof - (long)oneof->containing_type_->oneof_decls_) >> 3) *
                -0x49249249;
    io::Printer::Sub::Sub<int>(&local_1a0,&local_3d0,&local_43c);
    local_438 = &local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"cases","");
    local_e8 = &local_d8;
    if (local_438 == &local_428) {
      uStack_d0 = uStack_420;
    }
    else {
      local_e8 = local_438;
    }
    _local_d8 = CONCAT71(uStack_427,local_428);
    local_e0 = local_430;
    local_430 = 0;
    local_428 = 0;
    local_438 = &local_428;
    local_c8 = (long *)operator_new(0x20);
    *local_c8 = (long)&oneof;
    local_c8[1] = (long)&p_local;
    local_c8[2] = (long)local_4c0;
    *(undefined1 *)(local_c8 + 3) = 0;
    local_b0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    local_c0 = 0;
    local_b8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    local_a8 = 1;
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x522f0c);
    local_38 = 0;
    io::Printer::Emit(local_448,(Sub *)&field,4,0x28d,
                      "\n              if (const uint32_t oneof_from_case = from.$oneof_case$[$index$]) {\n                const uint32_t oneof_to_case = _this->$oneof_case$[$index$];\n                const bool oneof_needs_init = oneof_to_case != oneof_from_case;\n                if (oneof_needs_init) {\n                  if (oneof_to_case != 0) {\n                    _this->clear_$name$();\n                  }\n                  _this->$oneof_case$[$index$] = oneof_from_case;\n                }\n\n                switch (oneof_from_case) {\n                  $cases$;\n                  case $NAME$_NOT_SET:\n                    break;\n                }\n              }\n            "
                     );
    lVar29 = 0x2e0;
    do {
      if (*(char *)((long)&local_320._M_str + lVar29) == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_368 + lVar29 + 0x10));
      }
      plVar20 = (long *)((long)&__end3_1.descriptor + lVar29);
      if (plVar20 != *(long **)((long)&local_380 + lVar29)) {
        operator_delete(*(long **)((long)&local_380 + lVar29),*plVar20 + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[*(byte *)((long)&local_388 + lVar29)]._M_data)
                (&local_4a1,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_3b0 + lVar29 + 8));
      *(undefined1 *)((long)&local_388 + lVar29) = 0xff;
      if ((long *)(local_3b0 + lVar29 + -8) != *(long **)(local_3b0 + lVar29 + -0x18)) {
        operator_delete(*(long **)(local_3b0 + lVar29 + -0x18),
                        *(long *)(local_3b0 + lVar29 + -8) + 1);
      }
      lVar29 = lVar29 + -0xb8;
    } while (lVar29 != 0);
    if (local_438 != &local_428) {
      operator_delete(local_438,CONCAT71(uStack_427,local_428) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,
                      CONCAT71(local_478.field_2._M_allocated_capacity._1_7_,
                               local_478.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != &local_3a0) {
      operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
    }
    __begin3_1.idx = __begin3_1.idx + 1;
  }
  if (local_4c0->num_weak_fields_ != 0) {
    format_09._M_str = "_this->$weak_field_map$.MergeFrom(from.$weak_field_map$);\n";
    format_09._M_len = 0x3a;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (format.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&format.vars_,format_09);
  }
  if (0 < local_4c0->descriptor_->extension_range_count_) {
    io::Printer::Emit(p_local,0,0,0x52,
                      "\n      _this->$extensions$.MergeFrom(&default_instance(), from.$extensions$);\n    "
                     );
  }
  format_10._M_str =
       "_this->_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n";
  format_10._M_len = 0x57;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (format.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&format.vars_,format_10);
  io::Printer::Outdent(format.printer_);
  format_11._M_str = "}\n";
  format_11._M_len = 2;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (format.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&format.vars_,format_11);
  std::
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ::~vector(&chunks);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&format.vars_);
  return;
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeImpl(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  // Generate the class-specific MergeFrom, which avoids the ABSL_CHECK and
  // cast.
  Formatter format(p);
  format(
      "void $classname$::MergeImpl($pb$::MessageLite& to_msg, const "
      "$pb$::MessageLite& from_msg) {\n"
      "$WeakDescriptorSelfPin$"
      "  auto* const _this = static_cast<$classname$*>(&to_msg);\n"
      "  auto& from = static_cast<const $classname$&>(from_msg);\n");
  format.Indent();
  if (RequiresArena(GeneratorFunction::kMergeFrom)) {
    p->Emit(R"cc(
      $pb$::Arena* arena = _this->GetArena();
    )cc");
  }
  format(
      "$annotate_mergefrom$"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n");
  format("$DCHK$_NE(&from, _this);\n");

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  if (ShouldSplit(descriptor_, options_)) {
    format(
        "if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n"
        "  _this->PrepareSplitMessageForWrite();\n"
        "}\n");
  }

  std::vector<FieldChunk> chunks = CollectFields(
      optimized_order_, options_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b) &&
               IsLikelyPresent(a, options_) == IsLikelyPresent(b, options_) &&
               ShouldSplit(a, options_) == ShouldSplit(b, options_);
      });

  auto it = chunks.begin();
  auto end = chunks.end();
  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, MayGroupChunksForHaswordsCheck);
    bool has_haswords_check =
        MaybeEmitHaswordsCheck(it, next, options_, has_bit_indices_,
                               cached_has_word_index, "from.", p);

    while (it != next) {
      const std::vector<const FieldDescriptor*>& fields = it->fields;
      const bool cache_has_bits = HasByteIndex(fields.front()) != kNoHasbit;
      const bool check_has_byte = cache_has_bits && fields.size() > 1 &&
                                  !IsLikelyPresent(fields.back(), options_);

      DebugAssertUniformLikelyPresence(fields, options_);

      if (cache_has_bits &&
          cached_has_word_index != HasWordIndex(fields.front())) {
        cached_has_word_index = HasWordIndex(fields.front());
        format("cached_has_bits = from.$has_bits$[$1$];\n",
               cached_has_word_index);
      }

      if (check_has_byte) {
        // Emit an if() that will let us skip the whole chunk if none are set.
        uint32_t chunk_mask = GenChunkMask(fields, has_bit_indices_);

        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        ABSL_DCHECK_LE(2, popcnt(chunk_mask));
        ABSL_DCHECK_GE(8, popcnt(chunk_mask));

        format("if ($1$) {\n", GenerateConditionMaybeWithProbabilityForGroup(
                                   chunk_mask, fields, options_));
        format.Indent();
      }

      // Go back and emit merging code for each of the fields we processed.
      for (const auto* field : fields) {
        const auto& generator = field_generators_.get(field);

        if (field->is_repeated()) {
          generator.GenerateMergingCode(p);
        } else if (!field->is_required() && !field->is_repeated() &&
                   !HasHasbit(field)) {
          // Merge semantics without true field presence: primitive fields are
          // merged only if non-zero (numeric) or non-empty (string).
          MayEmitMutableIfNonDefaultCheck(
              p, "from.", field, ShouldSplit(field, options_), options_,
              /*emit_body=*/[&]() { generator.GenerateMergingCode(p); },
              /*with_enclosing_braces_always=*/true);
        } else if (field->options().weak() ||
                   cached_has_word_index != HasWordIndex(field)) {
          // Check hasbit, not using cached bits.
          auto v = p->WithVars(HasBitVars(field));
          format(
              "if ((from.$has_bits$[$has_array_index$] & $has_mask$) != 0) "
              "{\n");
          format.Indent();
          generator.GenerateMergingCode(p);
          format.Outdent();
          format("}\n");
        } else {
          // Check hasbit, using cached bits.
          ABSL_CHECK(HasHasbit(field));
          int has_bit_index = has_bit_indices_[field->index()];
          format("if ($1$) {\n", GenerateConditionMaybeWithProbabilityForField(
                                     has_bit_index, field, options_));
          format.Indent();

          if (GetFieldHasbitMode(field) == HasbitMode::kHintHasbit) {
            // Merge semantics without true field presence: primitive fields are
            // merged only if non-zero (numeric) or non-empty (string).
            MayEmitMutableIfNonDefaultCheck(
                p, "from.", field, ShouldSplit(field, options_), options_,
                /*emit_body=*/[&]() { generator.GenerateMergingCode(p); },
                /*with_enclosing_braces_always=*/false);
          } else {
            ABSL_DCHECK(GetFieldHasbitMode(field) == HasbitMode::kTrueHasbit);
            if (check_has_byte && IsPOD(field)) {
              generator.GenerateCopyConstructorCode(p);
            } else {
              generator.GenerateMergingCode(p);
            }
          }

          format.Outdent();
          format("}\n");
        }
      }

      if (check_has_byte) {
        format.Outdent();
        format("}\n");
      }

      // To next chunk.
      ++it;
    }

    if (has_haswords_check) {
      p->Outdent();
      p->Emit(R"cc(
        }
      )cc");

      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  if (HasBitsSize() == 1) {
    // Optimization to avoid a load. Assuming that most messages have fewer than
    // 32 fields, this seems useful.
    p->Emit(R"cc(
      _this->$has_bits$[0] |= cached_has_bits;
    )cc");
  } else if (HasBitsSize() > 1) {
    p->Emit(R"cc(
      _this->$has_bits$.Or(from.$has_bits$);
    )cc");
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    p->Emit({{"name", oneof->name()},
             {"NAME", absl::AsciiStrToUpper(oneof->name())},
             {"index", oneof->index()},
             {"cases",
              [&] {
                for (const auto* field : FieldRange(oneof)) {
                  p->Emit(
                      {{"Label", UnderscoresToCamelCase(field->name(), true)},
                       {"body",
                        [&] {
                          field_generators_.get(field).GenerateMergingCode(p);
                        }}},
                      R"cc(
                        case k$Label$: {
                          $body$;
                          break;
                        }
                      )cc");
                }
              }}},
            R"cc(
              if (const uint32_t oneof_from_case = from.$oneof_case$[$index$]) {
                const uint32_t oneof_to_case = _this->$oneof_case$[$index$];
                const bool oneof_needs_init = oneof_to_case != oneof_from_case;
                if (oneof_needs_init) {
                  if (oneof_to_case != 0) {
                    _this->clear_$name$();
                  }
                  _this->$oneof_case$[$index$] = oneof_from_case;
                }

                switch (oneof_from_case) {
                  $cases$;
                  case $NAME$_NOT_SET:
                    break;
                }
              }
            )cc");
  }
  if (num_weak_fields_) {
    format(
        "_this->$weak_field_map$.MergeFrom(from.$weak_field_map$);"
        "\n");
  }

  // Merging of extensions and unknown fields is done last, to maximize
  // the opportunity for tail calls.
  if (descriptor_->extension_range_count() > 0) {
    p->Emit(R"cc(
      _this->$extensions$.MergeFrom(&default_instance(), from.$extensions$);
    )cc");
  }

  format(
      "_this->_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._"
      "internal_"
      "metadata_);\n");

  format.Outdent();
  format("}\n");
}